

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O1

el_status_t c_complete(void)

{
  byte bVar1;
  byte *pbVar2;
  el_status_t eVar3;
  undefined8 in_RAX;
  char *token;
  byte *__s;
  size_t sVar4;
  byte *p;
  void *pvVar5;
  byte *pbVar6;
  byte *pbVar7;
  int unique;
  undefined8 uStack_38;
  
  if (rl_inhibit_complete != 0) {
    return CSdispatch;
  }
  uStack_38 = in_RAX;
  token = el_find_word();
  __s = (byte *)rl_complete(token,(int *)((long)&uStack_38 + 4));
  if (token != (char *)0x0) {
    free(token);
  }
  if (__s != (byte *)0x0) {
    sVar4 = strlen((char *)__s);
    p = (byte *)malloc(sVar4 * 2 + 1);
    if (p == (byte *)0x0) {
      free(__s);
      return CSstay;
    }
    bVar1 = *__s;
    pbVar2 = __s;
    pbVar7 = p;
    while (bVar1 != 0) {
      pbVar6 = pbVar2 + 1;
      if ((((char)bVar1 < ' ') ||
          (pvVar5 = memchr("\"#$&\'()*:;<=>?[\\]^`{|}~\n\t ",(uint)bVar1,0x1b),
          pvVar5 != (void *)0x0)) && ((uStack_38._4_4_ == 0 || (*pbVar6 != 0)))) {
        *pbVar7 = 0x5c;
        pbVar7 = pbVar7 + 1;
      }
      *pbVar7 = *pbVar2;
      pbVar7 = pbVar7 + 1;
      pbVar2 = pbVar6;
      bVar1 = *pbVar6;
    }
    *pbVar7 = 0;
    free(__s);
    if (sVar4 == 0) {
      eVar3 = CSdone;
    }
    else {
      eVar3 = insert_string((char *)p);
    }
    free(p);
    if (sVar4 != 0) {
      return eVar3;
    }
  }
  eVar3 = c_possible();
  return eVar3;
}

Assistant:

static el_status_t c_complete(void)
{
    char        *p, *q;
    char        *word, *string;
    size_t      len;
    int         unique;
    el_status_t s = CSdone;

    if (rl_inhibit_complete)
        return CSdispatch;

    word = el_find_word();
    p = rl_complete(word, &unique);
    if (word)
        free(word);
    if (p) {
        len = strlen(p);
        word = p;

        string = q = malloc(sizeof(char) * (2 * len + 1));
        if (!string) {
            free(word);
            return CSstay;
        }

        while (*p) {
            if ((*p < ' ' || strchr(SEPS, *p) != NULL)
                && (!unique || p[1] != 0)) {
                *q++ = '\\';
            }
            *q++ = *p++;
        }
        *q = '\0';
        free(word);

        if (len > 0) {
            s = insert_string(string);
#ifdef CONFIG_TERMINAL_BELL
            if (!unique)
                el_ring_bell();
#endif
        }
        free(string);

        if (len > 0)
            return s;
    }

    return c_possible();
}